

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_register_allocation.cpp
# Opt level: O0

void mocker::anon_unknown_2::storeVReg
               (shared_ptr<mocker::nasm::Register> *dest,shared_ptr<mocker::nasm::Addr> *val,
               RegMap<std::size_t> *offsets,Section *text)

{
  mapped_type *pmVar1;
  shared_ptr<mocker::nasm::Register> *__args_1;
  undefined1 local_40 [8];
  shared_ptr<mocker::nasm::MemoryAddr> memAddr;
  mapped_type offset;
  Section *text_local;
  RegMap<std::size_t> *offsets_local;
  shared_ptr<mocker::nasm::Addr> *val_local;
  shared_ptr<mocker::nasm::Register> *dest_local;
  
  pmVar1 = std::
           unordered_map<std::shared_ptr<mocker::nasm::Register>,_unsigned_long,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::pair<const_std::shared_ptr<mocker::nasm::Register>,_unsigned_long>_>_>
           ::at(offsets,dest);
  memAddr.super___shared_ptr<mocker::nasm::MemoryAddr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*pmVar1;
  __args_1 = nasm::rbp();
  std::
  make_shared<mocker::nasm::MemoryAddr,std::shared_ptr<mocker::nasm::Register>const&,unsigned_long>
            ((shared_ptr<mocker::nasm::Register> *)local_40,(unsigned_long *)__args_1);
  nasm::Section::
  emplaceInst<mocker::nasm::Mov,std::shared_ptr<mocker::nasm::MemoryAddr>&,std::shared_ptr<mocker::nasm::Addr>const&>
            (text,(shared_ptr<mocker::nasm::MemoryAddr> *)local_40,val);
  std::shared_ptr<mocker::nasm::MemoryAddr>::~shared_ptr
            ((shared_ptr<mocker::nasm::MemoryAddr> *)local_40);
  return;
}

Assistant:

void storeVReg(const std::shared_ptr<nasm::Register> &dest,
               const std::shared_ptr<nasm::Addr> &val,
               const RegMap<std::size_t> &offsets, nasm::Section &text) {
  auto offset = offsets.at(dest);
  auto memAddr = std::make_shared<nasm::MemoryAddr>(nasm::rbp(), -offset);
  text.emplaceInst<nasm::Mov>(memAddr, val);
}